

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O3

void __thiscall tst_qpromise_operators::move_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  PromiseResolver<void> PVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar8;
  QObject *pQVar9;
  int *piVar10;
  QEvent *pQVar11;
  PromiseDataBase<void,_void_()> *pPVar12;
  Data *pDVar13;
  QArrayData *pQVar14;
  char *pcVar15;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar16;
  QSharedData *pQVar17;
  PromiseData<void> *tmp;
  QByteArrayView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  PromiseResolver<void> resolver_1;
  QArrayData *local_108;
  Data *local_100;
  QPromise<void> *local_f8;
  QPromise<void> p0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  PromiseResolver<void> resolver_2;
  QPromise<void> local_c8;
  qsizetype local_b8;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_88;
  _Any_data local_80;
  _Manager_type local_70;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_60;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_58;
  _func_int **local_50;
  _func_int **local_48;
  int *local_40;
  QObject *local_38;
  
  QtPromise::QPromise<void>::resolve();
  QVar8 = p0.super_QPromiseBase<void>.m_d;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  bVar3 = (bool)(~bVar3 & ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                          _M_exception_object == (void *)0x0);
  local_80._M_pod_data[0] = bVar3;
  resolver.m_d.d._0_1_ = 1;
  pcVar6 = QTest::toString<bool>((bool *)local_80._M_pod_data);
  pcVar7 = QTest::toString<bool>((bool *)&resolver);
  cVar4 = QTest::compare_helper
                    (bVar3,"Compared values are not the same",pcVar6,pcVar7,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x40);
  if (cVar4 == '\0') goto LAB_0010616c;
  local_80._0_4_ = 0x2a;
  iVar5 = waitForValue<int>(&p0,(int *)0xffffffff,(int *)local_80._M_pod_data);
  cVar4 = QTest::qCompare(iVar5,0x2a,"waitForValue(p0, -1, 42)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                          ,0x41);
  if (cVar4 == '\0') goto LAB_0010616c;
  QVar8.d = (PromiseData<void> *)operator_new(0x58);
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&((QVar8.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0
  ;
  local_48 = (_func_int **)&PTR__PromiseDataBase_0011bb78;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011bb78;
  QReadWriteLock::QReadWriteLock(&((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_lock,0);
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_settled = false;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0
  ;
  local_50 = (_func_int **)&PTR__PromiseDataBase_0011bb00;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011bb00;
  LOCK();
  pQVar17 = &((QVar8.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar17 = &((QVar8.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_58.d = (Data *)&PTR__QPromiseBase_0011ba98;
  local_80._M_unused._M_object = &PTR__QPromiseBase_0011ba98;
  local_80._8_8_ = QVar8.d;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_80);
  local_60.d = (Data *)&PTR__QPromiseBase_0011bae0;
  local_80._M_unused._M_object = &PTR__QPromiseBase_0011bae0;
  if ((PromiseData<void> *)local_80._8_8_ != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = (QSharedData *)(local_80._8_8_ + 8);
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<void> *)local_80._8_8_ != (PromiseData<void> *)0x0)) {
      (**(code **)(*(long *)local_80._8_8_ + 8))();
    }
  }
  PVar2.m_d.d = resolver.m_d.d;
  bVar3 = true;
  if (resolver.m_d.d == (Data *)0x0) {
LAB_0010592e:
    QVar16.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) goto LAB_0010592e;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar3 = false;
    QVar16 = resolver.m_d.d;
  }
  pQVar9 = (QObject *)QThread::currentThread();
  if ((pQVar9 != (QObject *)0x0) &&
     (piVar10 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar9), local_40 = piVar10,
     local_38 = pQVar9, piVar10 != (int *)0x0)) {
    if ((piVar10[1] != 0) && (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
      if (piVar10[1] == 0) {
        pQVar9 = (QObject *)(QThread *)0x0;
      }
      pQVar9 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar9);
      if ((pQVar9 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
        pQVar11 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(pQVar11,None);
        *(undefined ***)pQVar11 = &PTR__Event_0011b830;
        *(Data **)(pQVar11 + 0x10) = QVar16.d;
        if (!bVar3) {
          LOCK();
          ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar9,pQVar11,0);
        piVar10 = local_40;
        if (local_40 == (int *)0x0) goto LAB_00105a09;
      }
    }
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      piVar10 = local_40;
      if (local_40 == (int *)0x0) {
        piVar10 = (int *)0x0;
      }
      operator_delete(piVar10);
    }
  }
LAB_00105a09:
  if (!bVar3) {
    LOCK();
    ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar16.d,0x10);
    }
    LOCK();
    ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar16.d,0x10);
    }
  }
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPVar12 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>;
      p0.super_QPromiseBase<void>.m_d.d = QVar8.d;
      (*pPVar12->_vptr_PromiseDataBase[1])();
      QVar8.d = p0.super_QPromiseBase<void>.m_d.d;
    }
  }
  p0.super_QPromiseBase<void>.m_d.d = QVar8.d;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_80._M_pod_data[0] = bVar3;
  resolver.m_d.d._0_1_ = 1;
  pcVar6 = QTest::toString<bool>((bool *)local_80._M_pod_data);
  pcVar7 = QTest::toString<bool>((bool *)&resolver);
  pcVar15 = "p0.isPending()";
  cVar4 = QTest::compare_helper
                    (bVar3,"Compared values are not the same",pcVar6,pcVar7,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x4a);
  if (cVar4 == '\0') goto LAB_0010616c;
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
  local_c8.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)0x0;
  local_b8 = 0;
  pPVar12 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar12->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar12->super_QSharedData = 0;
  (pPVar12->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->m_catchers).d.size = 0;
  (pPVar12->m_handlers).d.size = 0;
  (pPVar12->m_catchers).d.d = (Data *)0x0;
  (pPVar12->m_handlers).d.d = (Data *)0x0;
  (pPVar12->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&pPVar12->m_lock = 0;
  *(undefined8 *)&pPVar12->m_settled = 0;
  (pPVar12->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar12->_vptr_PromiseDataBase = local_48;
  QReadWriteLock::QReadWriteLock(&pPVar12->m_lock,0);
  QVar16.d = local_60.d;
  pPVar12->m_settled = false;
  (pPVar12->m_handlers).d.d = (Data *)0x0;
  (pPVar12->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar12->m_handlers).d.size = 0;
  (pPVar12->m_catchers).d.d = (Data *)0x0;
  (pPVar12->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->m_catchers).d.size = 0;
  (pPVar12->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar12->_vptr_PromiseDataBase = local_50;
  LOCK();
  (pPVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (pPVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar17 = &pPVar12->super_QSharedData;
  LOCK();
  (pPVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (pPVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_58.d;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            (&resolver_1,(QPromise<void> *)&resolver_2);
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)QVar16.d;
  if (pPVar12 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &pPVar12->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar12 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*pPVar12->_vptr_PromiseDataBase[1])();
    }
  }
  QVar8.d = p0.super_QPromiseBase<void>.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_e0.d = (Data *)0x0;
LAB_00105bf2:
    local_88.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_e0 = resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) goto LAB_00105bf2;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_88 = resolver_1.m_d.d;
  }
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_()> *)&local_80,(PromiseHandler<void,decltype(nullptr),void> *)0x0,
             &local_e0,(QPromiseResolve<void> *)&local_88,(QPromiseReject<void> *)pcVar15);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar8.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_80);
  if (local_70 != (_Manager_type)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  QVar8.d = p0.super_QPromiseBase<void>.m_d.d;
  local_108 = (QArrayData *)local_e0.d;
  if ((QArrayData *)local_e0.d != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&((QBasicAtomicInt *)&(local_e0.d)->super_QSharedData)->_q_value)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)&((QBasicAtomicInt *)&(local_e0.d)->super_QSharedData)->_q_value)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_100 = local_88.d;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f8 = &local_c8;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x18);
  *(QArrayData **)resolver.m_d.d = local_108;
  if (local_108 != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&(local_108->ref_)._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&(local_108->ref_)._q_value)->super_QAtomicInteger<int>).
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)local_100;
  if (local_100 == (Data *)0x0) {
    *(QPromise<void> **)((long)resolver.m_d.d + 0x10) = local_f8;
  }
  else {
    LOCK();
    (local_100->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_100->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QPromise<void> **)((long)resolver.m_d.d + 0x10) = local_f8;
    if (local_100 != (Data *)0x0) {
      LOCK();
      (local_100->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_100->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_100->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_100,0x10);
      }
    }
  }
  if (local_108 != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&(local_108->ref_)._q_value)->super_QAtomicInteger<int>).
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QAtomicInt *)&(local_108->ref_)._q_value)->super_QAtomicInteger<int>).
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)&(local_108->ref_)._q_value)->super_QAtomicInteger<int>).
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_108,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar8.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_88.d,0x10);
    }
  }
  if ((QArrayData *)local_e0.d != (QArrayData *)0x0) {
    LOCK();
    (((QAtomicInt *)&((QBasicAtomicInt *)&(local_e0.d)->super_QSharedData)->_q_value)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)&((QBasicAtomicInt *)&(local_e0.d)->super_QSharedData)->_q_value)->
           super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QAtomicInt *)&((QBasicAtomicInt *)&(local_e0.d)->super_QSharedData)->_q_value)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar12);
  while (bVar3 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar12);
  }
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar12->_vptr_PromiseDataBase[1])(pPVar12);
  }
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar12->_vptr_PromiseDataBase[1])(pPVar12);
  }
  QVar18.m_data = (storage_type *)0x3;
  QVar18.m_size = (qsizetype)&local_108;
  QString::fromUtf8(QVar18);
  pQVar14 = local_108;
  QVar19.m_data = (storage_type_conflict *)local_c8.super_QPromiseBase<void>.m_d.d;
  QVar19.m_size = local_b8;
  QVar20.m_data = (storage_type_conflict *)local_100;
  QVar20.m_size = (qsizetype)local_f8;
  cVar4 = QTest::qCompare(QVar19,QVar20,"waitForError(p0, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                          ,0x4b);
  if (pQVar14 != (QArrayData *)0x0) {
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar14,2,8);
    }
  }
  if ((QArrayData *)local_c8.super_QPromiseBase<void>._vptr_QPromiseBase != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8.super_QPromiseBase<void>._vptr_QPromiseBase)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8.super_QPromiseBase<void>._vptr_QPromiseBase)->_q_value).
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8.super_QPromiseBase<void>._vptr_QPromiseBase)->_q_value).
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.super_QPromiseBase<void>._vptr_QPromiseBase,2,8)
      ;
    }
  }
  if (cVar4 == '\0') goto LAB_0010616c;
  QVar8.d = (PromiseData<void> *)operator_new(0x58);
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&((QVar8.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0
  ;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = local_48;
  QReadWriteLock::QReadWriteLock(&((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_lock,0);
  QVar16.d = local_60.d;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_settled = false;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0
  ;
  ((QVar8.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = local_50;
  LOCK();
  pQVar17 = &((QVar8.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar17 = &((QVar8.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)local_58.d;
  local_c8.super_QPromiseBase<void>.m_d.d = QVar8.d;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,&local_c8);
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)QVar16.d;
  if (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar2.m_d.d = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  pDVar13 = (Data *)QThread::currentThread();
  if ((pDVar13 != (Data *)0x0) &&
     (pQVar14 = (QArrayData *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar13),
     local_108 = pQVar14, local_100 = pDVar13, pQVar14 != (QArrayData *)0x0)) {
    if (((pQVar14->flags).i != 0) && (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
      if ((pQVar14->flags).i == 0) {
        pDVar13 = (Data *)0x0;
      }
      pQVar9 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pDVar13);
      if ((pQVar9 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
        pQVar11 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(pQVar11,None);
        *(undefined ***)pQVar11 = &PTR__Event_0011b888;
        *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
         (pQVar11 + 0x10) = PVar2.m_d.d;
        if (PVar2.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar9,pQVar11,0);
        pQVar14 = local_108;
        if (local_108 == (QArrayData *)0x0) goto LAB_0010606e;
      }
    }
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      pQVar14 = local_108;
      if (local_108 == (QArrayData *)0x0) {
        pQVar14 = (QArrayData *)0x0;
      }
      operator_delete(pQVar14);
    }
  }
LAB_0010606e:
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPVar12 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>;
      p0.super_QPromiseBase<void>.m_d.d = QVar8.d;
      (*pPVar12->_vptr_PromiseDataBase[1])();
      QVar8.d = p0.super_QPromiseBase<void>.m_d.d;
    }
  }
  p0.super_QPromiseBase<void>.m_d.d = QVar8.d;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)CONCAT71(local_c8.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar3);
  resolver_2.m_d.d._0_1_ = 1;
  pcVar6 = QTest::toString<bool>((bool *)&local_c8);
  pcVar7 = QTest::toString<bool>((bool *)&resolver_2);
  cVar4 = QTest::compare_helper
                    (bVar3,"Compared values are not the same",pcVar6,pcVar7,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x53);
  if (cVar4 != '\0') {
    local_c8.super_QPromiseBase<void>._vptr_QPromiseBase =
         (_func_int **)CONCAT44(local_c8.super_QPromiseBase<void>._vptr_QPromiseBase._4_4_,0x2b);
    iVar5 = waitForValue<int>(&p0,(int *)0xffffffff,(int *)&local_c8);
    QTest::qCompare(iVar5,0x2b,"waitForValue(p0, -1, 43)","43",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                    ,0x54);
  }
LAB_0010616c:
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bae0;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::move_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1, 42), 42);

    p0 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1, 43), 43);
}